

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fftheap(fitsfile *fptr,LONGLONG *heapsz,LONGLONG *unused,LONGLONG *overlap,int *valid,
           int *status)

{
  char *pcVar1;
  size_t __size;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  uint colnum;
  int typecode;
  LONGLONG offset;
  LONGLONG repeat;
  LONGLONG twidth;
  LONGLONG trepeat;
  char message [81];
  int local_dc;
  void *local_d8;
  size_t *local_d0;
  long *local_c8;
  long *local_c0;
  int *local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  LONGLONG local_98;
  LONGLONG local_90;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_b8 = valid;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    iVar3 = ffrdef(fptr,status);
    if (0 < iVar3) goto LAB_0013fb46;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (local_b8 != (int *)0x0) {
    *local_b8 = 1;
  }
  if (heapsz != (LONGLONG *)0x0) {
    *heapsz = fptr->Fptr->heapsize;
  }
  if (unused != (LONGLONG *)0x0) {
    *unused = 0;
  }
  if (overlap != (LONGLONG *)0x0) {
    *overlap = 0;
  }
  if ((fptr->Fptr->hdutype == 2) && (__size = fptr->Fptr->heapsize, __size != 0)) {
    local_d8 = calloc(1,__size);
    if (local_d8 == (void *)0x0) {
      builtin_strncpy(local_88 + 0x20,"t the heap",0xb);
      builtin_strncpy(local_88 + 0x10,"te buffer to tes",0x10);
      builtin_strncpy(local_88,"Failed to alloca",0x10);
      ffxmsg(5,local_88);
      *status = 0x71;
      return 0x71;
    }
    local_d0 = (size_t *)heapsz;
    local_c8 = unused;
    local_c0 = overlap;
    if (0 < fptr->Fptr->tfield) {
      colnum = 1;
      do {
        if (0 < *status) break;
        ffgtclll(fptr,colnum,&local_dc,&local_90,&local_98,status);
        if ((local_dc < 1) && (0 < fptr->Fptr->numrows)) {
          local_b0 = (ulong)(uint)-local_dc / 10;
          lVar5 = 1;
          do {
            ffgdesll(fptr,colnum,lVar5,&local_a0,&local_a8,status);
            if (local_dc == -1) {
              lVar4 = local_a0 + 0xe;
              if (-1 < local_a0 + 7) {
                lVar4 = local_a0 + 7;
              }
              lVar4 = lVar4 >> 3;
            }
            else {
              lVar4 = local_a0 * local_b0;
            }
            if ((local_a8 < 0) || ((long)__size < local_a8 + lVar4)) {
              if (local_b8 != (int *)0x0) {
                *local_b8 = 0;
              }
              snprintf(local_88,0x51,"Descriptor in row %ld, column %d has invalid heap address",
                       lVar5,(ulong)colnum);
              ffxmsg(5,local_88);
            }
            else if (0 < lVar4) {
              lVar6 = 0;
              do {
                pcVar1 = (char *)((long)local_d8 + lVar6 + local_a8);
                *pcVar1 = *pcVar1 + '\x01';
                lVar6 = lVar6 + 1;
              } while (lVar4 != lVar6);
            }
            bVar2 = lVar5 < fptr->Fptr->numrows;
            lVar5 = lVar5 + 1;
          } while (bVar2);
        }
        bVar2 = (int)colnum < fptr->Fptr->tfield;
        colnum = colnum + 1;
      } while (bVar2);
    }
    if ((long)__size < 1) {
      lVar4 = 0;
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      lVar4 = 0;
      sVar7 = 0;
      do {
        lVar5 = lVar5 + (ulong)('\x01' < *(char *)((long)local_d8 + sVar7));
        lVar4 = lVar4 + (ulong)(*(char *)((long)local_d8 + sVar7) == '\0');
        sVar7 = sVar7 + 1;
      } while (__size != sVar7);
    }
    if (local_d0 != (size_t *)0x0) {
      *local_d0 = __size;
    }
    if (local_c8 != (long *)0x0) {
      *local_c8 = lVar4;
    }
    if (local_c0 != (long *)0x0) {
      *local_c0 = lVar5;
    }
    free(local_d8);
  }
LAB_0013fb46:
  return *status;
}

Assistant:

int fftheap(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG *heapsz,   /* O - current size of the heap               */
           LONGLONG *unused,   /* O - no. of unused bytes in the heap        */
           LONGLONG *overlap,  /* O - no. of bytes shared by > 1 descriptors */
           int  *valid,     /* O - are all the heap addresses valid?         */
           int *status)     /* IO - error status                             */
/*
  Tests the contents of the binary table variable length array heap.
  Returns the number of bytes that are currently not pointed to by any
  of the descriptors, and also the number of bytes that are pointed to
  by more than one descriptor.  It returns valid = FALSE if any of the
  descriptors point to addresses that are out of the bounds of the
  heap.
*/
{
    int jj, typecode, pixsize;
    long ii, kk, theapsz, nbytes;
    LONGLONG repeat, offset, tunused = 0, toverlap = 0;
    char *buffer, message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if ( fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header to make sure everything is up to date */
    else if ( ffrdef(fptr, status) > 0)               
        return(*status);

    if (valid) *valid = TRUE;
    if (heapsz) *heapsz = (fptr->Fptr)->heapsize;
    if (unused) *unused = 0;
    if (overlap) *overlap = 0;
    
    /* return if this is not a binary table HDU or if the heap is empty */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 )
        return(*status);

    if ((fptr->Fptr)->heapsize > LONG_MAX) {
        ffpmsg("Heap is too big to test ( > 2**31 bytes). (fftheap)");
        return(*status = MEMORY_ALLOCATION);
    }

    theapsz = (long) (fptr->Fptr)->heapsize;
    buffer = calloc(1, theapsz);     /* allocate temp space */
    if (!buffer )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to test the heap");
        ffpmsg(message);
        return(*status = MEMORY_ALLOCATION);
    }

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(fptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(fptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            if (offset < 0 || offset + nbytes > theapsz)
            {
                if (valid) *valid = FALSE;  /* address out of bounds */
                snprintf(message,FLEN_ERRMSG,
                "Descriptor in row %ld, column %d has invalid heap address",
                ii, jj);
                ffpmsg(message);
            }
            else
            {
                for (kk = 0; kk < nbytes; kk++)
                    buffer[kk + offset]++;   /* increment every used byte */
            }
        }
    }

    for (kk = 0; kk < theapsz; kk++)
    {
        if (buffer[kk] == 0)
            tunused++;
        else if (buffer[kk] > 1)
            toverlap++;
    }

    if (heapsz) *heapsz = theapsz;
    if (unused) *unused = tunused;
    if (overlap) *overlap = toverlap;

    free(buffer);
    return(*status);
}